

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestCommand.cxx
# Opt level: O2

cmCTestGenericHandler * __thiscall cmCTestTestCommand::InitializeHandler(cmCTestTestCommand *this)

{
  cmMakefile *pcVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  cmCTest *pcVar5;
  undefined4 extraout_var;
  pointer ppcVar6;
  char *str;
  ostream *poVar7;
  double dVar8;
  allocator<char> local_1d9;
  string local_1d8;
  unsigned_long testLoad;
  ostringstream testsToRunString;
  cmCTestGenericHandler *this_00;
  
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testsToRunString,"CTEST_TEST_TIMEOUT",(allocator<char> *)&local_1d8);
  pcVar4 = cmMakefile::GetDefinition(pcVar1,(string *)&testsToRunString);
  std::__cxx11::string::~string((string *)&testsToRunString);
  if (pcVar4 == (char *)0x0) {
    pcVar5 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    dVar8 = (pcVar5->TimeOut).__r;
    if (dVar8 <= 0.0) {
      dVar8 = 600.0;
    }
  }
  else {
    dVar8 = atof(pcVar4);
    pcVar5 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  }
  (pcVar5->TimeOut).__r = dVar8;
  iVar3 = (*(this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand._vptr_cmCommand
            [0xc])(this);
  this_00 = (cmCTestGenericHandler *)CONCAT44(extraout_var,iVar3);
  ppcVar6 = (this->super_cmCTestHandlerCommand).Values.
            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (((ppcVar6[8] != (char *)0x0) || (ppcVar6[9] != (char *)0x0)) || (ppcVar6[10] != (char *)0x0))
  {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&testsToRunString);
    pcVar4 = (this->super_cmCTestHandlerCommand).Values.
             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_start[8];
    if (pcVar4 != (char *)0x0) {
      std::operator<<((ostream *)&testsToRunString,pcVar4);
    }
    std::operator<<((ostream *)&testsToRunString,",");
    pcVar4 = (this->super_cmCTestHandlerCommand).Values.
             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_start[9];
    if (pcVar4 != (char *)0x0) {
      std::operator<<((ostream *)&testsToRunString,pcVar4);
    }
    std::operator<<((ostream *)&testsToRunString,",");
    pcVar4 = (this->super_cmCTestHandlerCommand).Values.
             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_start[10];
    if (pcVar4 != (char *)0x0) {
      std::operator<<((ostream *)&testsToRunString,pcVar4);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"TestsToRunInformation",&local_1d9);
    std::__cxx11::stringbuf::str();
    cmCTestGenericHandler::SetOption(this_00,&local_1d8,(char *)testLoad);
    std::__cxx11::string::~string((string *)&testLoad);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&testsToRunString);
    ppcVar6 = (this->super_cmCTestHandlerCommand).Values.
              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  if (ppcVar6[0xb] != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&testsToRunString,"ExcludeRegularExpression",(allocator<char> *)&local_1d8)
    ;
    cmCTestGenericHandler::SetOption
              (this_00,(string *)&testsToRunString,
               (this->super_cmCTestHandlerCommand).Values.
               super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start[0xb]);
    std::__cxx11::string::~string((string *)&testsToRunString);
    ppcVar6 = (this->super_cmCTestHandlerCommand).Values.
              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  if (ppcVar6[0xc] != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&testsToRunString,"IncludeRegularExpression",(allocator<char> *)&local_1d8)
    ;
    cmCTestGenericHandler::SetOption
              (this_00,(string *)&testsToRunString,
               (this->super_cmCTestHandlerCommand).Values.
               super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start[0xc]);
    std::__cxx11::string::~string((string *)&testsToRunString);
    ppcVar6 = (this->super_cmCTestHandlerCommand).Values.
              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  if (ppcVar6[0xd] != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&testsToRunString,"ExcludeLabelRegularExpression",
               (allocator<char> *)&local_1d8);
    cmCTestGenericHandler::SetOption
              (this_00,(string *)&testsToRunString,
               (this->super_cmCTestHandlerCommand).Values.
               super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start[0xd]);
    std::__cxx11::string::~string((string *)&testsToRunString);
    ppcVar6 = (this->super_cmCTestHandlerCommand).Values.
              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  if (ppcVar6[0xe] != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&testsToRunString,"LabelRegularExpression",(allocator<char> *)&local_1d8);
    cmCTestGenericHandler::SetOption
              (this_00,(string *)&testsToRunString,
               (this->super_cmCTestHandlerCommand).Values.
               super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start[0xe]);
    std::__cxx11::string::~string((string *)&testsToRunString);
    ppcVar6 = (this->super_cmCTestHandlerCommand).Values.
              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  if (ppcVar6[0xf] != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&testsToRunString,"ExcludeFixtureRegularExpression",
               (allocator<char> *)&local_1d8);
    cmCTestGenericHandler::SetOption
              (this_00,(string *)&testsToRunString,
               (this->super_cmCTestHandlerCommand).Values.
               super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start[0xf]);
    std::__cxx11::string::~string((string *)&testsToRunString);
    ppcVar6 = (this->super_cmCTestHandlerCommand).Values.
              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  if (ppcVar6[0x10] != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&testsToRunString,"ExcludeFixtureSetupRegularExpression",
               (allocator<char> *)&local_1d8);
    cmCTestGenericHandler::SetOption
              (this_00,(string *)&testsToRunString,
               (this->super_cmCTestHandlerCommand).Values.
               super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start[0x10]);
    std::__cxx11::string::~string((string *)&testsToRunString);
    ppcVar6 = (this->super_cmCTestHandlerCommand).Values.
              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  if (ppcVar6[0x11] != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&testsToRunString,"ExcludeFixtureCleanupRegularExpression",
               (allocator<char> *)&local_1d8);
    cmCTestGenericHandler::SetOption
              (this_00,(string *)&testsToRunString,
               (this->super_cmCTestHandlerCommand).Values.
               super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start[0x11]);
    std::__cxx11::string::~string((string *)&testsToRunString);
    ppcVar6 = (this->super_cmCTestHandlerCommand).Values.
              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  if (ppcVar6[0x12] != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&testsToRunString,"ParallelLevel",(allocator<char> *)&local_1d8);
    cmCTestGenericHandler::SetOption
              (this_00,(string *)&testsToRunString,
               (this->super_cmCTestHandlerCommand).Values.
               super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start[0x12]);
    std::__cxx11::string::~string((string *)&testsToRunString);
    ppcVar6 = (this->super_cmCTestHandlerCommand).Values.
              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  if (ppcVar6[0x13] != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&testsToRunString,"ScheduleRandom",(allocator<char> *)&local_1d8);
    cmCTestGenericHandler::SetOption
              (this_00,(string *)&testsToRunString,
               (this->super_cmCTestHandlerCommand).Values.
               super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start[0x13]);
    std::__cxx11::string::~string((string *)&testsToRunString);
    ppcVar6 = (this->super_cmCTestHandlerCommand).Values.
              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  if (ppcVar6[0x14] != (char *)0x0) {
    pcVar5 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&testsToRunString,ppcVar6[0x14],(allocator<char> *)&local_1d8);
    cmCTest::SetStopTime(pcVar5,(string *)&testsToRunString);
    std::__cxx11::string::~string((string *)&testsToRunString);
  }
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testsToRunString,"CTEST_TEST_LOAD",(allocator<char> *)&local_1d8);
  str = cmMakefile::GetDefinition(pcVar1,(string *)&testsToRunString);
  std::__cxx11::string::~string((string *)&testsToRunString);
  pcVar4 = (this->super_cmCTestHandlerCommand).Values.
           super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
           super__Vector_impl_data._M_start[0x15];
  if ((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) {
    if ((str == (char *)0x0) || (*str == '\0')) {
      testLoad = ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest)->TestLoad;
      goto LAB_00184352;
    }
    bVar2 = cmSystemTools::StringToULong(str,&testLoad);
    if (bVar2) goto LAB_00184352;
    testLoad = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&testsToRunString);
    poVar7 = std::operator<<((ostream *)&testsToRunString,"Invalid value for \'CTEST_TEST_LOAD\' : "
                            );
    poVar7 = std::operator<<(poVar7,str);
    std::endl<char,std::char_traits<char>>(poVar7);
    pcVar5 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar5,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestTestCommand.cxx"
                 ,0x7c,local_1d8._M_dataplus._M_p,false);
  }
  else {
    bVar2 = cmSystemTools::StringToULong(pcVar4,&testLoad);
    if (bVar2) goto LAB_00184352;
    testLoad = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&testsToRunString);
    poVar7 = std::operator<<((ostream *)&testsToRunString,"Invalid value for \'TEST_LOAD\' : ");
    poVar7 = std::operator<<(poVar7,(this->super_cmCTestHandlerCommand).Values.
                                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start[0x15]);
    std::endl<char,std::char_traits<char>>(poVar7);
    pcVar5 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar5,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestTestCommand.cxx"
                 ,0x75,local_1d8._M_dataplus._M_p,false);
  }
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&testsToRunString);
LAB_00184352:
  this_00->TestLoad = testLoad;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testsToRunString,"CTEST_LABELS_FOR_SUBPROJECTS",
             (allocator<char> *)&local_1d8);
  pcVar4 = cmMakefile::GetDefinition(pcVar1,(string *)&testsToRunString);
  std::__cxx11::string::~string((string *)&testsToRunString);
  if (pcVar4 != (char *)0x0) {
    cmCTest::SetCTestConfiguration
              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"LabelsForSubprojects"
               ,pcVar4,(this->super_cmCTestHandlerCommand).Quiet);
  }
  this_00->Quiet = (this->super_cmCTestHandlerCommand).Quiet;
  return this_00;
}

Assistant:

cmCTestGenericHandler* cmCTestTestCommand::InitializeHandler()
{
  const char* ctestTimeout =
    this->Makefile->GetDefinition("CTEST_TEST_TIMEOUT");

  cmDuration timeout;
  if (ctestTimeout) {
    timeout = cmDuration(atof(ctestTimeout));
  } else {
    timeout = this->CTest->GetTimeOut();
    if (timeout <= cmDuration::zero()) {
      // By default use timeout of 10 minutes
      timeout = std::chrono::minutes(10);
    }
  }
  this->CTest->SetTimeOut(timeout);
  cmCTestGenericHandler* handler = this->InitializeActualHandler();
  if (this->Values[ctt_START] || this->Values[ctt_END] ||
      this->Values[ctt_STRIDE]) {
    std::ostringstream testsToRunString;
    if (this->Values[ctt_START]) {
      testsToRunString << this->Values[ctt_START];
    }
    testsToRunString << ",";
    if (this->Values[ctt_END]) {
      testsToRunString << this->Values[ctt_END];
    }
    testsToRunString << ",";
    if (this->Values[ctt_STRIDE]) {
      testsToRunString << this->Values[ctt_STRIDE];
    }
    handler->SetOption("TestsToRunInformation",
                       testsToRunString.str().c_str());
  }
  if (this->Values[ctt_EXCLUDE]) {
    handler->SetOption("ExcludeRegularExpression", this->Values[ctt_EXCLUDE]);
  }
  if (this->Values[ctt_INCLUDE]) {
    handler->SetOption("IncludeRegularExpression", this->Values[ctt_INCLUDE]);
  }
  if (this->Values[ctt_EXCLUDE_LABEL]) {
    handler->SetOption("ExcludeLabelRegularExpression",
                       this->Values[ctt_EXCLUDE_LABEL]);
  }
  if (this->Values[ctt_INCLUDE_LABEL]) {
    handler->SetOption("LabelRegularExpression",
                       this->Values[ctt_INCLUDE_LABEL]);
  }
  if (this->Values[ctt_EXCLUDE_FIXTURE]) {
    handler->SetOption("ExcludeFixtureRegularExpression",
                       this->Values[ctt_EXCLUDE_FIXTURE]);
  }
  if (this->Values[ctt_EXCLUDE_FIXTURE_SETUP]) {
    handler->SetOption("ExcludeFixtureSetupRegularExpression",
                       this->Values[ctt_EXCLUDE_FIXTURE_SETUP]);
  }
  if (this->Values[ctt_EXCLUDE_FIXTURE_CLEANUP]) {
    handler->SetOption("ExcludeFixtureCleanupRegularExpression",
                       this->Values[ctt_EXCLUDE_FIXTURE_CLEANUP]);
  }
  if (this->Values[ctt_PARALLEL_LEVEL]) {
    handler->SetOption("ParallelLevel", this->Values[ctt_PARALLEL_LEVEL]);
  }
  if (this->Values[ctt_SCHEDULE_RANDOM]) {
    handler->SetOption("ScheduleRandom", this->Values[ctt_SCHEDULE_RANDOM]);
  }
  if (this->Values[ctt_STOP_TIME]) {
    this->CTest->SetStopTime(this->Values[ctt_STOP_TIME]);
  }

  // Test load is determined by: TEST_LOAD argument,
  // or CTEST_TEST_LOAD script variable, or ctest --test-load
  // command line argument... in that order.
  unsigned long testLoad;
  const char* ctestTestLoad = this->Makefile->GetDefinition("CTEST_TEST_LOAD");
  if (this->Values[ctt_TEST_LOAD] && *this->Values[ctt_TEST_LOAD]) {
    if (!cmSystemTools::StringToULong(this->Values[ctt_TEST_LOAD],
                                      &testLoad)) {
      testLoad = 0;
      cmCTestLog(this->CTest, WARNING,
                 "Invalid value for 'TEST_LOAD' : "
                   << this->Values[ctt_TEST_LOAD] << std::endl);
    }
  } else if (ctestTestLoad && *ctestTestLoad) {
    if (!cmSystemTools::StringToULong(ctestTestLoad, &testLoad)) {
      testLoad = 0;
      cmCTestLog(this->CTest, WARNING,
                 "Invalid value for 'CTEST_TEST_LOAD' : " << ctestTestLoad
                                                          << std::endl);
    }
  } else {
    testLoad = this->CTest->GetTestLoad();
  }
  handler->SetTestLoad(testLoad);

  if (const char* labelsForSubprojects =
        this->Makefile->GetDefinition("CTEST_LABELS_FOR_SUBPROJECTS")) {
    this->CTest->SetCTestConfiguration("LabelsForSubprojects",
                                       labelsForSubprojects, this->Quiet);
  }

  handler->SetQuiet(this->Quiet);
  return handler;
}